

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O2

HTMLElement * __thiscall choc::html::HTMLElement::addDiv(HTMLElement *this)

{
  HTMLElement *pHVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"div",&local_31);
  pHVar1 = addChild(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pHVar1;
}

Assistant:

HTMLElement& addDiv()                               { return addChild ("div"); }